

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void Am_Get_Selection_In_Display_Order
               (Am_Object *selection_widget,Am_Value_List *selected_objs,Am_Object *group)

{
  Am_Value *pAVar1;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Value_List local_50 [2];
  undefined1 local_30 [8];
  Am_Value_List unsorted_sel_objs;
  Am_Object *group_local;
  Am_Value_List *selected_objs_local;
  Am_Object *selection_widget_local;
  
  unsorted_sel_objs.item = (Am_List_Item *)group;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  pAVar1 = Am_Object::Get(selection_widget,0x169,0);
  Am_Value_List::operator=((Am_Value_List *)local_30,pAVar1);
  pAVar1 = Am_Object::Get(selection_widget,0x193,0);
  Am_Object::operator=((Am_Object *)unsorted_sel_objs.item,pAVar1);
  Am_Value_List::Am_Value_List(&local_60,(Am_Value_List *)local_30);
  Am_Object::Am_Object(&local_68,(Am_Object *)unsorted_sel_objs.item);
  Am_Sort_Obs_In_Group(local_50,(Am_Object *)&local_60);
  Am_Value_List::operator=(selected_objs,local_50);
  Am_Value_List::~Am_Value_List(local_50);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return;
}

Assistant:

void
Am_Get_Selection_In_Display_Order(Am_Object selection_widget,
                                  Am_Value_List &selected_objs,
                                  Am_Object &group)
{
  Am_Value_List unsorted_sel_objs;
  unsorted_sel_objs = selection_widget.Get(Am_VALUE);
  group = selection_widget.Get(Am_OPERATES_ON);
  selected_objs = Am_Sort_Obs_In_Group(unsorted_sel_objs, group);
}